

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::torrent::want_peers_finished(torrent *this)

{
  bool local_19;
  torrent *this_local;
  
  if ((((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7) ==
       4) || (local_19 = false,
             ((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) &
             7) == 5)) {
    local_19 = want_peers(this);
  }
  return local_19;
}

Assistant:

bool torrent::want_peers_finished() const
	{
		return (m_state == torrent_status::finished
			|| m_state == torrent_status::seeding)
			&& want_peers();
	}